

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

attr_counter * attr_counter_new(mtree_entry_conflict *me,attr_counter *prev)

{
  attr_counter *paVar1;
  attr_counter *ac;
  attr_counter *prev_local;
  mtree_entry_conflict *me_local;
  
  paVar1 = (attr_counter *)malloc(0x20);
  if (paVar1 != (attr_counter *)0x0) {
    paVar1->prev = prev;
    paVar1->next = (attr_counter *)0x0;
    paVar1->count = 1;
    paVar1->m_entry = me;
  }
  return paVar1;
}

Assistant:

static struct attr_counter *
attr_counter_new(struct mtree_entry *me, struct attr_counter *prev)
{
	struct attr_counter *ac;

	ac = malloc(sizeof(*ac));
	if (ac != NULL) {
		ac->prev = prev;
		ac->next = NULL;
		ac->count = 1;
		ac->m_entry = me;
	}
	return (ac);
}